

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

LogicalConstant mp::internal::ExprBase::Create<mp::LogicalConstant>(Impl *impl)

{
  bool bVar1;
  Kind k;
  char *message;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> in_RDI;
  LogicalConstant expr;
  AssertionFailure *in_stack_ffffffffffffffe0;
  
  if (in_RDI.super_ExprBase.impl_ != (Impl *)0x0) {
    k = Impl::kind((Impl *)in_RDI.super_ExprBase.impl_);
    bVar1 = Is<mp::LogicalConstant>(k);
    if (!bVar1) {
      message = (char *)__cxa_allocate_exception(0x10);
      AssertionFailure::AssertionFailure(in_stack_ffffffffffffffe0,message);
      __cxa_throw(message,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
    }
  }
  LogicalConstant::LogicalConstant((LogicalConstant *)0x19f632);
  return (LogicalConstant)(Impl *)in_RDI.super_ExprBase.impl_;
}

Assistant:

static TargetExpr Create(const ExprBase::Impl *impl) {
    MP_ASSERT((!impl || internal::Is<TargetExpr>(impl->kind())),
              "invalid expression kind");
    TargetExpr expr;
    expr.impl_ = impl;
    return expr;
  }